

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

void __thiscall
libcellml::Validator::ValidatorImpl::validateUnits
          (ValidatorImpl *this,UnitsPtr *units,History *history,
          vector<std::shared_ptr<libcellml::Model>,_std::allocator<std::shared_ptr<libcellml::Model>_>_>
          *modelsVisited,string *sourceUrl)

{
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  IssueImpl *pIVar4;
  IssuePtr *pIVar5;
  bool bVar6;
  __type _Var7;
  __type _Var8;
  size_t initialErrorCount;
  size_t sVar9;
  size_t sVar10;
  size_t i;
  pointer psVar11;
  ulong uVar12;
  string *name;
  string *issue_00;
  string *psVar13;
  ulong uVar14;
  ulong uVar15;
  ReferenceRule RVar16;
  IssuePtr issue;
  Strings names;
  UnitsPtr tmpUnits;
  IssuePtr issue_1;
  Strings importUnitsRefs;
  string unitsName;
  HistoryEpochPtr h;
  string unitsRef;
  ModelPtr model;
  IssuesList importIssueList;
  IssuePtr issue_4;
  ImportSourcePtr importSource;
  string local_108;
  string unitsImportUrl;
  ulong local_b0;
  IssuePtr issue_8;
  UnitsPtr importedUnits;
  ModelPtr importSourceModel;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  issue_00 = (string *)&issue;
  psVar13 = (string *)&issue;
  std::__shared_ptr<libcellml::Units_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Units,void>
            ((__shared_ptr<libcellml::Units_const,(__gnu_cxx::_Lock_policy)2> *)&unitsRef,
             &units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&unitsName,"",(allocator<char> *)&unitsImportUrl);
  createHistoryEpoch((libcellml *)&h,(UnitsConstPtr *)&unitsRef,sourceUrl,&unitsName);
  std::__cxx11::string::~string((string *)&unitsName);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&unitsRef._M_string_length);
  bVar6 = checkForLocalCycles(history,&h);
  if (bVar6) {
    std::
    vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
    ::push_back(history,&h);
    unitsName._M_dataplus._M_p = (pointer)&unitsName.field_2;
    unitsName._M_string_length = 0;
    unitsName.field_2._M_local_buf[0] = '\0';
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    psVar1 = (history->
             super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (psVar11 = (history->
                   super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar1;
        psVar11 = psVar11 + 1) {
      if (unitsName._M_string_length != 0) {
        std::__cxx11::string::append((char *)&unitsName);
      }
      std::operator+(&unitsImportUrl,"\'",
                     &((psVar11->
                       super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->mName);
      std::operator+(&unitsRef,&unitsImportUrl,"\'");
      std::__cxx11::string::~string((string *)&unitsImportUrl);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&names,&unitsRef);
      std::__cxx11::string::append((string *)&unitsName);
      std::__cxx11::string::~string((string *)&unitsRef);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,&names);
    bVar6 = hasCycleAlreadyBeenReported(this,&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    if (!bVar6) {
      Issue::IssueImpl::create();
      pIVar4 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl;
      std::operator+(&unitsImportUrl,"Cyclic units exist: ",&unitsName);
      std::operator+(&unitsRef,&unitsImportUrl,".");
      Issue::IssueImpl::setDescription(pIVar4,&unitsRef);
      std::__cxx11::string::~string((string *)&unitsRef);
      std::__cxx11::string::~string((string *)&unitsImportUrl);
      AnyCellmlElement::AnyCellmlElementImpl::setUnits
                ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   mPimpl->mItem).
                  super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->mPimpl,units);
      Issue::IssueImpl::setReferenceRule
                ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl,UNIT_UNITS_CIRCULAR_REFERENCE);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
    }
    std::
    vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
    ::pop_back(history);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&names);
    goto LAB_0021b98d;
  }
  NamedEntity::name_abi_cxx11_
            (&unitsName,
             &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_NamedEntity);
  initialErrorCount = Logger::issueCount(&this->mValidator->super_Logger);
  psVar2 = (modelsVisited->
           super__Vector_base<std::shared_ptr<libcellml::Model>,_std::allocator<std::shared_ptr<libcellml::Model>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  psVar3 = (modelsVisited->
           super__Vector_base<std::shared_ptr<libcellml::Model>,_std::allocator<std::shared_ptr<libcellml::Model>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  unitsRef._M_dataplus._M_p = (pointer)&unitsRef.field_2;
  unitsRef._M_string_length = 0;
  unitsImportUrl._M_dataplus._M_p = (pointer)&unitsImportUrl.field_2;
  unitsImportUrl._M_string_length = 0;
  unitsRef.field_2._M_local_buf[0] = '\0';
  unitsImportUrl.field_2._M_local_buf[0] = '\0';
  bVar6 = ImportedEntity::isImport
                    (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->super_ImportedEntity);
  if (bVar6) {
    ImportedEntity::importReference_abi_cxx11_
              ((string *)&names,
               &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_ImportedEntity);
    std::__cxx11::string::operator=((string *)&unitsRef,(string *)&names);
    std::__cxx11::string::~string((string *)&names);
    ImportedEntity::importSource((ImportedEntity *)&issue);
    ImportSource::url_abi_cxx11_
              ((string *)&names,
               (ImportSource *)
               issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__cxx11::string::operator=((string *)&unitsImportUrl,(string *)&names);
    std::__cxx11::string::~string((string *)&names);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::_M_assign
              ((string *)
               &(h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                mReferenceName);
    ImportedEntity::importSource((ImportedEntity *)&tmpUnits);
    ImportSource::url_abi_cxx11_
              ((string *)&issue,
               (ImportSource *)
               tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    importeeModelUrl((string *)&names,history,(string *)&issue);
    std::__cxx11::string::operator=
              ((string *)
               &(h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                mSourceUrl,(string *)&names);
    std::__cxx11::string::~string((string *)&names);
    std::__cxx11::string::~string((string *)&issue);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  name = (string *)&names;
  std::__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Units,void>
            ((__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2> *)name,
             &units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>);
  owningModel((ParentedEntityConstPtr *)&model);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  uVar12 = 0;
  local_b0 = 0;
  uVar15 = 0;
  while( true ) {
    sVar9 = Model::unitsCount(model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
    if ((sVar9 <= uVar15) ||
       ((long)(modelsVisited->
              super__Vector_base<std::shared_ptr<libcellml::Model>,_std::allocator<std::shared_ptr<libcellml::Model>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(modelsVisited->
              super__Vector_base<std::shared_ptr<libcellml::Model>,_std::allocator<std::shared_ptr<libcellml::Model>_>_>
              )._M_impl.super__Vector_impl_data._M_start != 0x10)) break;
    Model::units((Model *)&tmpUnits,
                 (size_t)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
    NamedEntity::name_abi_cxx11_
              ((string *)&names,
               &(tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_NamedEntity);
    name = &unitsName;
    _Var7 = std::operator==((string *)&names,name);
    std::__cxx11::string::~string((string *)&names);
    bVar6 = ImportedEntity::isImport
                      (&(tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super_ImportedEntity);
    if (bVar6) {
      ImportedEntity::importReference_abi_cxx11_
                ((string *)&names,
                 &(tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->super_ImportedEntity);
      name = &unitsRef;
      _Var8 = std::operator==((string *)&names,name);
      if (_Var8) {
        ImportedEntity::importSource((ImportedEntity *)&importUnitsRefs);
        ImportSource::url_abi_cxx11_
                  ((string *)&issue,
                   (ImportSource *)
                   importUnitsRefs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        name = &unitsImportUrl;
        _Var8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&issue,name);
        std::__cxx11::string::~string((string *)&issue);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &importUnitsRefs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        uVar14 = (ulong)_Var8;
      }
      else {
        uVar14 = 0;
      }
      std::__cxx11::string::~string((string *)&names);
      local_b0 = local_b0 + uVar14;
    }
    uVar12 = uVar12 + _Var7;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    uVar15 = uVar15 + 1;
  }
  bVar6 = ImportedEntity::isImport
                    (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->super_ImportedEntity);
  if (bVar6) {
    sVar9 = Logger::issueCount(&this->mValidator->super_Logger);
    bVar6 = isCellmlIdentifier(&unitsRef);
    if (!bVar6) {
      makeIssueIllegalIdentifier((ValidatorImpl *)&issue_1,name);
      pIVar4 = (issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmpUnits,
                     "Imported units \'",&unitsName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmpUnits,
                     "\' does not have a valid units_ref attribute. ");
      Issue::description_abi_cxx11_
                ((string *)&importUnitsRefs,
                 issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&names,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &importUnitsRefs);
      Issue::IssueImpl::setDescription(pIVar4,(string *)&names);
      std::__cxx11::string::~string((string *)&names);
      std::__cxx11::string::~string((string *)&importUnitsRefs);
      std::__cxx11::string::~string((string *)&issue);
      std::__cxx11::string::~string((string *)&tmpUnits);
      AnyCellmlElement::AnyCellmlElementImpl::setUnits
                ((((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl->mItem).
                  super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->mPimpl,units);
      Issue::IssueImpl::setReferenceRule
                ((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl,IMPORT_UNITS_UNITS_REFERENCE_VALUE);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    ImportedEntity::importSource((ImportedEntity *)&importSource);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&names,"units",(allocator<char> *)&issue);
    validateImportSource(this,&importSource,&unitsName,(string *)&names);
    std::__cxx11::string::~string((string *)&names);
    sVar10 = Logger::issueCount(&this->mValidator->super_Logger);
    if ((sVar10 <= sVar9) && (1 < local_b0)) {
      NamedEntity::name_abi_cxx11_
                (&local_108,
                 (NamedEntity *)
                 model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &importIssueList,"Model \'",&local_108);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &importIssueList,"\' contains multiple imported units from \'");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &importUnitsRefs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_1,
                     &unitsImportUrl);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmpUnits,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &importUnitsRefs,"\' with the same units_ref attribute \'");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmpUnits,
                     &unitsRef);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&names,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                     "\'.");
      std::__cxx11::string::~string((string *)&issue);
      std::__cxx11::string::~string((string *)&tmpUnits);
      std::__cxx11::string::~string((string *)&importUnitsRefs);
      std::__cxx11::string::~string((string *)&issue_1);
      std::__cxx11::string::~string((string *)&importIssueList);
      std::__cxx11::string::~string((string *)&local_108);
      bVar6 = checkIssuesForDuplications(this,(string *)&names);
      if (!bVar6) {
        Issue::IssueImpl::create();
        Issue::IssueImpl::setDescription
                  ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   mPimpl,(string *)&names);
        AnyCellmlElement::AnyCellmlElementImpl::setModel
                  ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->mPimpl->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,&model,MODEL);
        Issue::IssueImpl::setReferenceRule
                  ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   mPimpl,IMPORT_UNITS_UNITS_REFERENCE);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::__cxx11::string::~string((string *)&names);
    }
    ImportSource::model((ImportSource *)&importSourceModel);
    name = (string *)
           importSourceModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (importSourceModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      Model::units((Model *)&importedUnits,
                   (string *)
                   importSourceModel.
                   super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        Issue::IssueImpl::create();
        pIVar4 = (issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl;
        NamedEntity::name_abi_cxx11_
                  (&local_108,
                   &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->super_NamedEntity);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &importIssueList,"Imported units \'",&local_108);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_1
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &importIssueList,"\' refers to units \'");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &importUnitsRefs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_1
                       ,&unitsRef);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tmpUnits,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &importUnitsRefs,"\' which does not appear in \'");
        ImportSource::url_abi_cxx11_
                  ((string *)&issue_8,
                   importSource.
                   super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tmpUnits,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_8
                      );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&names,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                       "\'.");
        Issue::IssueImpl::setDescription(pIVar4,(string *)&names);
        std::__cxx11::string::~string((string *)&names);
        std::__cxx11::string::~string((string *)&issue);
        std::__cxx11::string::~string((string *)&issue_8);
        std::__cxx11::string::~string((string *)&tmpUnits);
        std::__cxx11::string::~string((string *)&importUnitsRefs);
        std::__cxx11::string::~string((string *)&issue_1);
        std::__cxx11::string::~string((string *)&importIssueList);
        std::__cxx11::string::~string((string *)&local_108);
        AnyCellmlElement::AnyCellmlElementImpl::setUnits
                  ((((issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,units);
        Issue::IssueImpl::setReferenceRule
                  ((issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl,IMPORT_UNITS_UNITS_REFERENCE_VALUE_TARGET);
        issue_00 = (string *)&issue_4;
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)issue_00);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      else {
        tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        importUnitsRefs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        importUnitsRefs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        importUnitsRefs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        importIssueList.
        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        importIssueList.
        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        importIssueList.
        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar6 = checkForImportCycles(history,&h);
        if (bVar6) {
          std::
          vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
          ::push_back(history,&h);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&issue,"resolve",(allocator<char> *)&local_108);
          formDescriptionOfCyclicDependency((string *)&names,history,(string *)&issue);
          std::__cxx11::string::~string((string *)&issue);
          Issue::IssueImpl::create();
          Issue::IssueImpl::setDescription
                    ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->mPimpl,(string *)&names);
          AnyCellmlElement::AnyCellmlElementImpl::setUnits
                    ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl->mItem).
                      super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,units);
          Issue::IssueImpl::setReferenceRule
                    ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->mPimpl,IMPORT_UNITS_UNITS_REFERENCE);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::string::~string((string *)&names);
        }
        else {
          std::
          vector<std::shared_ptr<libcellml::Model>,_std::allocator<std::shared_ptr<libcellml::Model>_>_>
          ::push_back(modelsVisited,&importSourceModel);
          std::
          vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
          ::push_back(history,&h);
          ImportSource::url_abi_cxx11_
                    ((string *)&names,
                     importSource.
                     super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          issue_00 = (string *)&importedUnits;
          validateUnits(this,(UnitsPtr *)issue_00,history,modelsVisited,(string *)&names);
          std::__cxx11::string::~string((string *)&names);
          std::
          vector<std::shared_ptr<libcellml::Model>,_std::allocator<std::shared_ptr<libcellml::Model>_>_>
          ::pop_back(modelsVisited);
        }
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(&importIssueList);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&issue_1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&importUnitsRefs);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&tmpUnits);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      name = issue_00;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&importSourceModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  if (1 < uVar12) {
    NamedEntity::name_abi_cxx11_
              ((string *)&issue_1,
               (NamedEntity *)
               model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &importUnitsRefs,"Model \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmpUnits,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &importUnitsRefs,"\' contains multiple units with the name \'");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmpUnits,
                   &unitsName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&names,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                   "\'. Valid units names must be unique to their model.");
    std::__cxx11::string::~string((string *)&issue);
    std::__cxx11::string::~string((string *)&tmpUnits);
    std::__cxx11::string::~string((string *)&importUnitsRefs);
    std::__cxx11::string::~string((string *)&issue_1);
    name = (string *)&names;
    bVar6 = checkIssuesForDuplications(this,name);
    if (!bVar6) {
      Issue::IssueImpl::create();
      Issue::IssueImpl::setDescription
                ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl,(string *)&names);
      AnyCellmlElement::AnyCellmlElementImpl::setModel
                ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   mPimpl->mItem).
                  super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->mPimpl,&model,MODEL);
      bVar6 = ImportedEntity::isImport
                        (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)
                          ._M_ptr)->super_ImportedEntity);
      RVar16 = UNITS_NAME_UNIQUE;
      if (bVar6) {
        RVar16 = IMPORT_UNITS_NAME_UNIQUE;
      }
      Issue::IssueImpl::setReferenceRule
                ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl,RVar16);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      name = psVar13;
    }
    std::__cxx11::string::~string((string *)&names);
  }
  bVar6 = isCellmlIdentifier(&unitsName);
  if (bVar6) {
    bVar6 = isStandardUnitName(&unitsName);
    if (bVar6) {
      Issue::IssueImpl::create();
      pIVar4 = (IssueImpl *)
               ((tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                     "Units is named \'",&unitsName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&names,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                     "\' which is a protected standard unit name.");
      Issue::IssueImpl::setDescription(pIVar4,(string *)&names);
      std::__cxx11::string::~string((string *)&names);
      std::__cxx11::string::~string((string *)&issue);
      AnyCellmlElement::AnyCellmlElementImpl::setUnits
                (*(AnyCellmlElementImpl **)
                  ((tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl[1].mId.
                  _M_string_length,units);
      Issue::IssueImpl::setReferenceRule
                ((IssueImpl *)
                 ((tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,UNITS_STANDARD);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&tmpUnits);
      pIVar5 = (IssuePtr *)&tmpUnits;
      goto LAB_0021b704;
    }
  }
  else {
    makeIssueIllegalIdentifier((ValidatorImpl *)&issue_1,name);
    AnyCellmlElement::AnyCellmlElementImpl::setUnits
              ((((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl,units);
    bVar6 = ImportedEntity::isImport
                      (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_ImportedEntity);
    pIVar4 = (issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl;
    if (bVar6) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmpUnits,
                     "Imported units \'",&unitsName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmpUnits,
                     "\' does not have a valid name attribute. ");
      Issue::description_abi_cxx11_
                ((string *)&importUnitsRefs,
                 issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&names,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &importUnitsRefs);
      Issue::IssueImpl::setDescription(pIVar4,(string *)&names);
      std::__cxx11::string::~string((string *)&names);
      std::__cxx11::string::~string((string *)&importUnitsRefs);
      std::__cxx11::string::~string((string *)&issue);
      std::__cxx11::string::~string((string *)&tmpUnits);
      RVar16 = IMPORT_UNITS_NAME_VALUE;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmpUnits,
                     "Units \'",&unitsName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmpUnits,
                     "\' does not have a valid name attribute. ");
      Issue::description_abi_cxx11_
                ((string *)&importUnitsRefs,
                 issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&names,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &importUnitsRefs);
      Issue::IssueImpl::setDescription(pIVar4,(string *)&names);
      std::__cxx11::string::~string((string *)&names);
      std::__cxx11::string::~string((string *)&importUnitsRefs);
      std::__cxx11::string::~string((string *)&issue);
      std::__cxx11::string::~string((string *)&tmpUnits);
      RVar16 = UNITS_NAME_VALUE;
    }
    Issue::IssueImpl::setReferenceRule
              ((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,RVar16);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_1);
    pIVar5 = &issue_1;
LAB_0021b704:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)
                &pIVar5->super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>)->
                _M_refcount);
  }
  Entity::id_abi_cxx11_
            ((string *)&names,
             (Entity *)
             (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  bVar6 = isValidXmlName((string *)&names);
  std::__cxx11::string::~string((string *)&names);
  if (!bVar6) {
    Issue::IssueImpl::create();
    Issue::IssueImpl::setReferenceRule
              ((issue_8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,XML_ID_ATTRIBUTE);
    AnyCellmlElement::AnyCellmlElementImpl::setUnits
              ((((issue_8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl,units);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&names,"Units",(allocator<char> *)&issue);
    bVar6 = ImportedEntity::isImport
                      (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_ImportedEntity);
    if (bVar6) {
      std::__cxx11::string::assign((char *)&names);
    }
    pIVar4 = (issue_8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &importIssueList,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&names," \'"
                  );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &importIssueList,&unitsName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &importUnitsRefs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_1,
                   "\' does not have a valid \'id\' attribute, \'");
    Entity::id_abi_cxx11_
              (&local_108,
               (Entity *)
               (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmpUnits,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &importUnitsRefs,&local_108);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmpUnits,
                   "\'.");
    Issue::IssueImpl::setDescription(pIVar4,(string *)&issue);
    std::__cxx11::string::~string((string *)&issue);
    std::__cxx11::string::~string((string *)&tmpUnits);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&importUnitsRefs);
    std::__cxx11::string::~string((string *)&issue_1);
    std::__cxx11::string::~string((string *)&importIssueList);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_8);
    std::__cxx11::string::~string((string *)&names);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&issue_8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
  sVar9 = Units::unitCount((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr);
  if (sVar9 != 0) {
    std::
    vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
    ::push_back(history,&h);
    uVar12 = 0;
    while( true ) {
      sVar9 = Units::unitCount((units->
                               super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr);
      if (sVar9 <= uVar12) break;
      validateUnitsUnitsItem(this,uVar12,units,history,modelsVisited);
      uVar12 = uVar12 + 1;
    }
    std::
    vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
    ::pop_back(history);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&names,"Units",(allocator<char> *)&tmpUnits);
  issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  handleErrorsFromImports
            (this,initialErrorCount,(long)psVar2 - (long)psVar3 == 0x10,(string *)&names,&unitsName,
             history,(ComponentPtr *)&issue,units);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&names);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&unitsImportUrl);
  std::__cxx11::string::~string((string *)&unitsRef);
LAB_0021b98d:
  std::__cxx11::string::~string((string *)&unitsName);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return;
}

Assistant:

void Validator::ValidatorImpl::validateUnits(const UnitsPtr &units, History &history, std::vector<ModelPtr> &modelsVisited, const std::string &sourceUrl)
{
    auto h = createHistoryEpoch(units, sourceUrl);
    if (checkForLocalCycles(history, h)) {
        history.push_back(h);
        std::string des;
        Strings names;
        for (const auto &entry : history) {
            if (!des.empty()) {
                des += " -> ";
            }
            auto tmp = "'" + entry->mName + "'";
            names.push_back(tmp);
            des += tmp;
        }
        if (!hasCycleAlreadyBeenReported(names)) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Cyclic units exist: " + des + ".");
            issue->mPimpl->mItem->mPimpl->setUnits(units);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNIT_UNITS_CIRCULAR_REFERENCE);
            addIssue(issue);
        }
        history.pop_back();
        return;
    }

    std::string unitsName = units->name();
    size_t initialIssueCount = mValidator->issueCount();
    bool isOriginatingModel = modelsVisited.size() == 1;

    std::string unitsRef;
    std::string unitsImportUrl;
    if (units->isImport()) {
        unitsRef = units->importReference();
        unitsImportUrl = units->importSource()->url();
        h->mReferenceName = unitsRef;
        h->mSourceUrl = importeeModelUrl(history, units->importSource()->url());
    }

    auto model = owningModel(units);

    size_t unitsWithNameCount = 0;
    size_t unitsWithImportSource = 0;
    for (size_t i = 0; (i < model->unitsCount()) && (modelsVisited.size() == 1); ++i) {
        auto tmpUnits = model->units(i);
        if (tmpUnits->name() == unitsName) {
            unitsWithNameCount += 1;
        }
        if (tmpUnits->isImport()) {
            if (tmpUnits->importReference() == unitsRef && tmpUnits->importSource()->url() == unitsImportUrl) {
                unitsWithImportSource += 1;
            }
        }
    }

    if (units->isImport()) {
        // Check for a units_ref.
        size_t currentIssueCount = mValidator->issueCount();
        if (!isCellmlIdentifier(unitsRef)) {
            auto issue = makeIssueIllegalIdentifier(unitsRef);
            issue->mPimpl->setDescription("Imported units '" + unitsName + "' does not have a valid units_ref attribute. " + issue->description());
            issue->mPimpl->mItem->mPimpl->setUnits(units);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_UNITS_REFERENCE_VALUE);
            addIssue(issue);
        }

        auto importSource = units->importSource();
        validateImportSource(importSource, unitsName, "units");

        bool foundImportIssue = mValidator->issueCount() > currentIssueCount;

        // Check if we already have another import from the same source with the same units_ref.
        // (This looks for matching entries at the same position in the source and ref vectors).
        if (!foundImportIssue && (unitsWithImportSource > 1)) {
            auto description = "Model '" + model->name() + "' contains multiple imported units from '" + unitsImportUrl + "' with the same units_ref attribute '" + unitsRef + "'.";
            if (!checkIssuesForDuplications(description)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription(description);
                issue->mPimpl->mItem->mPimpl->setModel(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_UNITS_REFERENCE);
                addIssue(issue);
            }
        }

        auto importSourceModel = importSource->model();
        if (importSourceModel != nullptr) {
            auto importedUnits = importSourceModel->units(unitsRef);
            if (importedUnits != nullptr) {
                Strings importUnitsNames;
                Strings importUnitsRefs;
                Strings importUnitsImportSources;
                IssuesList importIssueList;

                if (checkForImportCycles(history, h)) {
                    history.push_back(h);
                    auto description = formDescriptionOfCyclicDependency(history, "resolve");
                    IssuePtr issue = Issue::IssueImpl::create();
                    issue->mPimpl->setDescription(description);
                    issue->mPimpl->mItem->mPimpl->setUnits(units);
                    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_UNITS_REFERENCE);
                    addIssue(issue);
                } else {
                    modelsVisited.push_back(importSourceModel);
                    history.push_back(h);
                    validateUnits(importedUnits, history, modelsVisited, importSource->url());
                    modelsVisited.pop_back();
                }
            } else {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Imported units '" + units->name() + "' refers to units '" + unitsRef + "' which does not appear in '" + importSource->url() + "'.");
                issue->mPimpl->mItem->mPimpl->setUnits(units);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_UNITS_REFERENCE_VALUE_TARGET);
                addIssue(issue);
            }
        }
    }
    // Check for duplicate units names in this model.
    if (unitsWithNameCount > 1) {
        std::string description = "Model '" + model->name() + "' contains multiple units with the name '" + unitsName + "'. Valid units names must be unique to their model.";
        if (!checkIssuesForDuplications(description)) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription(description);
            issue->mPimpl->mItem->mPimpl->setModel(model);
            if (units->isImport()) {
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_NAME_UNIQUE);
            } else {
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNITS_NAME_UNIQUE);
            }

            addIssue(issue);
        }
    }
    // Check for a valid name attribute.
    if (!isCellmlIdentifier(unitsName)) {
        auto issue = makeIssueIllegalIdentifier(unitsName);
        issue->mPimpl->mItem->mPimpl->setUnits(units);
        if (units->isImport()) {
            issue->mPimpl->setDescription("Imported units '" + unitsName + "' does not have a valid name attribute. " + issue->description());
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_NAME_VALUE);
        } else {
            issue->mPimpl->setDescription("Units '" + unitsName + "' does not have a valid name attribute. " + issue->description());
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNITS_NAME_VALUE);
        }
        addIssue(issue);
    } else {
        // Check for a matching standard units.
        if (isStandardUnitName(unitsName)) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Units is named '" + unitsName + "' which is a protected standard unit name.");
            issue->mPimpl->mItem->mPimpl->setUnits(units);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNITS_STANDARD);
            addIssue(issue);
        }
    }
    // Check for a valid identifier.
    if (!isValidXmlName(units->id())) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
        issue->mPimpl->mItem->mPimpl->setUnits(units);
        std::string descriptionStart = "Units";
        if (units->isImport()) {
            descriptionStart = "Imported units";
        }
        issue->mPimpl->setDescription(descriptionStart + " '" + unitsName + "' does not have a valid 'id' attribute, '" + units->id() + "'.");
        addIssue(issue);
    }

    if (units->unitCount() > 0) {
        history.push_back(h);
        for (size_t i = 0; i < units->unitCount(); ++i) {
            validateUnitsUnitsItem(i, units, history, modelsVisited);
        }
        history.pop_back();
    }

    handleErrorsFromImports(initialIssueCount, isOriginatingModel, "Units", unitsName, history, nullptr, units);
}